

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O2

int ffgsky(fitsfile *fptr,char *keyname,int firstchar,int maxchar,char *value,int *valuelen,
          char *comm,int *status)

{
  size_t sVar1;
  char *pcVar2;
  size_t sVar3;
  bool bVar4;
  uint local_154;
  int keynum;
  size_t local_148;
  char *local_140;
  int local_134;
  size_t local_130;
  char valstring [71];
  char nextcomm [73];
  char card [81];
  
  keynum = 0;
  if (0 < *status) {
    return *status;
  }
  *value = '\0';
  if (valuelen != (int *)0x0) {
    *valuelen = 0;
  }
  card[0] = '\0';
  if (comm != (char *)0x0) {
    *comm = '\0';
  }
  local_134 = firstchar;
  ffgcrd(fptr,keyname,card,status);
  if (0 < *status) {
    return *status;
  }
  sVar1 = strlen(card);
  ffpsvc(card,valstring,comm,status);
  if (0 < *status) {
    return *status;
  }
  local_148 = sVar1;
  if (comm == (char *)0x0) {
    local_154 = 0;
  }
  else {
    sVar1 = strlen(comm);
    local_154 = 0x48 - (int)sVar1;
  }
  if (valstring[0] == '\0') {
    pcVar2 = (char *)malloc(1);
    *pcVar2 = '\0';
  }
  else {
    sVar1 = strlen(valstring);
    pcVar2 = (char *)malloc(sVar1 + 1);
    ffc2s(valstring,pcVar2,status);
    local_140 = pcVar2;
    sVar1 = strlen(pcVar2);
    while( true ) {
      bVar4 = false;
      do {
        sVar3 = sVar1;
        if ((bVar4) || (0 < *status)) goto LAB_001a8b65;
        bVar4 = true;
        sVar1 = 0;
      } while (sVar3 == 0);
      if (local_140[sVar3 - 1] != '&') break;
      valstring[0] = '\0';
      nextcomm[0] = '\0';
      ffgcnt(fptr,valstring,nextcomm,status);
      pcVar2 = local_140;
      if (nextcomm[0] == '\0' && valstring[0] == '\0') break;
      local_140[sVar3 - 1] = '\0';
      sVar1 = sVar3;
      if (valstring[0] != '\0') {
        sVar1 = strlen(valstring);
        local_130 = (sVar1 + sVar3) - 1;
        local_140 = (char *)realloc(pcVar2,sVar3 + sVar1);
        strcat(local_140,valstring);
        sVar1 = local_130;
      }
      if ((nextcomm[0] != '\0') && (0 < (int)local_154)) {
        if ((*comm != '\0') && (local_148 < 0x50)) {
          sVar3 = strlen(comm);
          (comm + sVar3)[0] = ' ';
          (comm + sVar3)[1] = '\0';
          local_154 = local_154 - 1;
        }
        strncat(comm,nextcomm,(ulong)local_154);
        sVar3 = strlen(comm);
        local_154 = 0x48 - (int)sVar3;
      }
      ffghps(fptr,(int *)0x0,&keynum,status);
      ffgrec(fptr,keynum + -1,card,status);
      local_148 = strlen(card);
    }
LAB_001a8b65:
    pcVar2 = local_140;
    if (local_140 == (char *)0x0) goto LAB_001a8bb5;
  }
  sVar1 = strlen(pcVar2);
  if ((ulong)(long)local_134 <= sVar1) {
    strncat(value,pcVar2 + ((long)local_134 - 1),(long)maxchar);
  }
  free(pcVar2);
  if (valuelen != (int *)0x0) {
    *valuelen = (int)sVar1;
  }
LAB_001a8bb5:
  return *status;
}

Assistant:

int ffgsky( fitsfile *fptr,     /* I - FITS file pointer             */
           const char *keyname, /* I - name of keyword to read       */
           int firstchar,       /* I - first character of string to return */
           int maxchar,         /* I - maximum length of string to return */
	                        /*    (string will be null terminated)  */      
           char *value,         /* O - pointer to keyword value      */
           int *valuelen,       /* O - total length of the keyword value string */
                                /*     The returned 'value' string may only */
				/*     contain a piece of the total string, depending */
				/*     on the value of firstchar and maxchar */
           char *comm,          /* O - keyword comment (may be NULL) */
           int  *status)        /* IO - error status                 */
/*
  Read and return the value of the specified string-valued keyword.
  
  This new routine was added in 2016 to provide a more convenient user
  interface than the older ffgkls routine.

  Read a string keyword, returning up to 'naxchars' characters of the value
  starting with the 'firstchar' character.
  The input 'value' string must be allocated at least 1 char bigger to
  allow for the terminating null character.
  
  This routine may be used to read continued string keywords that use 
  the CONTINUE keyword convention, as well as normal string keywords
  that are contained within a single header record.
  
  This routine differs from the ffkls routine in that it does not
  internally allocate memory for the returned value string, and consequently
  the calling routine does not need to call fffree to free the memory.
*/
{
    char valstring[FLEN_VALUE], nextcomm[FLEN_COMMENT], card[FLEN_CARD];
    char *tempstring;
    int contin, commSpace = 0, addCommDelim=0, keynum=0;
    size_t len;

    if (*status > 0)
        return(*status);

    tempstring = NULL;  /* initialize in case of error */
    *value = '\0';
    if (valuelen) *valuelen = 0;
    
    card[0] = '\0';
    if (comm)
       comm[0] = '\0';
    ffgcrd(fptr, keyname, card, status);
    if (*status > 0)
       return(*status);
    if (strlen(card) < FLEN_CARD-1)
       addCommDelim=1;
    ffpsvc(card,valstring, comm, status);    
    if (*status > 0)
        return(*status);

    if (comm)
    {
        /* remaining space in comment string */
        commSpace = FLEN_COMMENT-1 - strlen(comm);
    }
    
    if (!valstring[0])   /* null value string? */
    {
      tempstring = (char *) malloc(1);  /* allocate and return a null string */
      *tempstring = '\0';
    }
    else
    {
      /* allocate space,  plus 1 for null */
      tempstring = (char *) malloc(strlen(valstring) + 1);

      ffc2s(valstring, tempstring, status);   /* convert string to value */
      len = strlen(tempstring);

      /* If last character is a & then value may be continued on next keyword */
      contin = 1;
      while (contin && *status <= 0)  
      {
        if (len && *(tempstring+len-1) == '&')  /*  is last char an ampersand?  */
        {
            valstring[0] = '\0';
            nextcomm[0] = '\0';
            ffgcnt(fptr, valstring, nextcomm, status);
            if (*valstring || *nextcomm)  /* If either valstring or nextcom
                                  is filled, this must be a CONTINUE line */  
            {
               *(tempstring+len-1) = '\0';         /* erase the trailing & char */
               if (*valstring)
               {
                  len += strlen(valstring) - 1;
                  tempstring = (char *) realloc(tempstring, len + 1); /* increase size */
                  strcat(tempstring, valstring);     /* append the continued chars */
               }
               if (*nextcomm)
               {
	          if ((commSpace > 0) && (*nextcomm != 0)) 
	          {
                     /* If in here, input 'comm' cannot be 0 */
                     /* concantenate comment strings (if any) */
                     if (strlen(comm) && addCommDelim)
                     {
                        strcat(comm, " ");
                        commSpace -=1;
                     }
		     strncat(comm, nextcomm, commSpace);
                     commSpace = FLEN_COMMENT-1 - strlen(comm);
                  }
               }
               /* Determine if a space delimiter is needed for next
                  comment concatenation (if any).  Assume it is if card length
                  of the most recently read keyword is less than max. 
                  keynum is 1-based. */
               ffghps(fptr,0,&keynum,status);
               ffgrec(fptr, keynum-1, card, status);
               addCommDelim = (strlen(card) < FLEN_CARD-1) ? 1 : 0;
            }
            else
	    {
                contin = 0;
            }
        }
        else
	{
            contin = 0;
	}
      }
    }
    
    if (tempstring) 
    {
        len = strlen(tempstring);
	if (firstchar <= len)
            strncat(value, tempstring + (firstchar - 1), maxchar);
        free(tempstring);
	if (valuelen) *valuelen = len;  /* total length of the keyword value */
    }
    
    return(*status);
}